

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Symbol(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
         *this,Static_String *t_s,bool t_disallow_prevention)

{
  char *pcVar1;
  ulong t_distance;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  size_t sVar11;
  string_view t_str;
  string_view t_str_00;
  Depth_Counter dc;
  Depth_Counter local_40;
  char *local_38;
  undefined8 uStack_30;
  
  Depth_Counter::Depth_Counter(&local_40,this);
  SkipWS(this,false);
  iVar4 = (this->m_position).line;
  iVar5 = (this->m_position).col;
  pcVar1 = (this->m_position).m_pos;
  local_38 = (this->m_position).m_end;
  uStack_30 = *(undefined8 *)&(this->m_position).m_last_col;
  t_distance = t_s->m_size;
  pcVar2 = (this->m_position).m_end;
  if (t_distance <= (ulong)((long)pcVar2 - (long)pcVar1)) {
    pcVar7 = "";
    if (pcVar1 != pcVar2) {
      pcVar7 = pcVar1;
    }
    if (t_distance != 0) {
      uVar8 = 0;
      do {
        if (t_s->data[uVar8] != pcVar7[uVar8]) goto LAB_003574f2;
        uVar8 = uVar8 + 1;
      } while (t_distance != uVar8);
    }
    Position::operator+=(&this->m_position,t_distance);
    pbVar3 = (byte *)(this->m_position).m_pos;
    bVar10 = true;
    if ((pbVar3 == (byte *)(this->m_position).m_end || t_disallow_prevention) ||
       (m_alphabet._M_elems[0]._M_elems[*pbVar3] != true)) goto LAB_003574f4;
    if (*pbVar3 != 0x3d) {
      sVar11 = (long)pbVar3 - (long)pcVar1;
      if (pcVar1 == (char *)0x0) {
        sVar11 = 0;
      }
      t_str._M_str = pcVar1;
      t_str._M_len = sVar11;
      bVar6 = Operator_Matches::is_match(&m_operator_matches,t_str);
      if (bVar6) {
        pcVar2 = (this->m_position).m_pos;
        pcVar9 = (char *)0x0;
        pcVar7 = pcVar9;
        if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
          pcVar9 = pcVar1;
          pcVar7 = pcVar2 + ((ulong)(pcVar2 != (this->m_position).m_end) - (long)pcVar1);
        }
        t_str_00._M_str = pcVar9;
        t_str_00._M_len = (size_t)pcVar7;
        bVar6 = Operator_Matches::is_match(&m_operator_matches,t_str_00);
        if (!bVar6) goto LAB_003574f4;
      }
    }
    (this->m_position).line = iVar4;
    (this->m_position).col = iVar5;
    (this->m_position).m_pos = pcVar1;
    (this->m_position).m_last_col = (int)uStack_30;
    (this->m_position).m_end = local_38;
  }
LAB_003574f2:
  bVar10 = false;
LAB_003574f4:
  (local_40.parser)->m_current_parse_depth = (local_40.parser)->m_current_parse_depth - 1;
  return bVar10;
}

Assistant:

bool Symbol(const utility::Static_String &t_s, const bool t_disallow_prevention = false) {
        Depth_Counter dc{this};
        SkipWS();
        const auto start = m_position;
        bool retval = Symbol_(t_s);

        // ignore substring matches
        if (retval && m_position.has_more() && (t_disallow_prevention == false) && char_in_alphabet(*m_position, detail::symbol_alphabet)) {
          if (*m_position != '=' && is_operator(Position::str(start, m_position)) && !is_operator(Position::str(start, m_position + 1))) {
            // don't throw this away, it's a good match and the next is not
          } else {
            m_position = start;
            retval = false;
          }
        }

        return retval;
      }